

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<char[21]>(ostream *out,char *fmt,char (*args) [21])

{
  long in_FS_OFFSET;
  FormatList local_30;
  FormatArg local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.m_args = &local_20;
  local_30.m_N = 1;
  local_20.m_formatImpl = detail::FormatArg::formatImpl<char[21]>;
  local_20.m_toIntImpl = detail::FormatArg::toIntImpl<char[21]>;
  local_20.m_value = args;
  vformat(out,fmt,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}